

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_new_path_list_predicate(lyd_node *list,char *list_name,char *predicate,int *parsed)

{
  long lVar1;
  char *__s1;
  char *__src;
  ulong uVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  lyd_node *plVar6;
  LY_ERR *pLVar7;
  size_t __n;
  int iVar8;
  char *local_60;
  char *value;
  char *name;
  ulong local_48;
  int local_40;
  int local_3c;
  int val_len;
  int has_predicate;
  int nam_len;
  
  name = (char *)list->schema;
  has_predicate =
       parse_schema_json_predicate(predicate,&value,&val_len,&local_60,&local_40,&local_3c);
  iVar8 = val_len;
  pcVar5 = value;
  if ((has_predicate < 1) || (iVar3 = strncmp(value,".",(long)val_len), iVar3 == 0)) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)predicate[-(long)has_predicate],predicate + -(long)has_predicate);
    return -1;
  }
  ppuVar4 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar4 + (long)*pcVar5 * 2 + 1) & 8) == 0) {
    if (name[0x1e] != '\0') {
      local_48 = 0;
      while (__src = local_60, *parsed = *parsed + has_predicate, local_60 != (char *)0x0) {
        lVar1 = *(long *)(name + 0x80);
        __s1 = (char *)**(undefined8 **)(lVar1 + local_48 * 8);
        iVar3 = strncmp(__s1,pcVar5,(long)iVar8);
        if ((iVar3 != 0) || (__s1[iVar8] != '\0')) break;
        __n = (size_t)local_40;
        pcVar5 = (char *)malloc(__n + 1);
        if (pcVar5 == (char *)0x0) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_path_list_predicate");
          return -1;
        }
        strncpy(pcVar5,__src,__n);
        uVar2 = local_48;
        pcVar5[__n] = '\0';
        plVar6 = _lyd_new_leaf(list,*(lys_node **)(lVar1 + local_48 * 8),pcVar5,0);
        free(pcVar5);
        if (plVar6 == (lyd_node *)0x0) {
          return -1;
        }
        if ((ulong)(byte)name[0x1e] <= uVar2 + 1) {
          return 0;
        }
        if (local_3c == 0) {
          ly_vlog(LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,list_name);
          return -1;
        }
        predicate = predicate + (uint)has_predicate;
        local_48 = uVar2 + 1;
        has_predicate =
             parse_schema_json_predicate(predicate,&value,&val_len,&local_60,&local_40,&local_3c);
        iVar8 = val_len;
        pcVar5 = value;
        if ((has_predicate < 1) || (iVar3 = strncmp(value,".",(long)val_len), iVar3 == 0)) {
          ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                  (ulong)(uint)(int)predicate[-(long)has_predicate],predicate + -(long)has_predicate
                 );
          return -1;
        }
      }
      ly_vlog(LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcVar5);
      return -1;
    }
  }
  else {
    *parsed = *parsed + has_predicate;
  }
  return 0;
}

Assistant:

static int
lyd_new_path_list_predicate(struct lyd_node *list, const char *list_name, const char *predicate, int *parsed)
{
    const char *name, *value;
    char *key_val;
    int r, i, nam_len, val_len, has_predicate;
    struct lys_node_list *slist;

    slist = (struct lys_node_list *)list->schema;

    /* is the predicate a number? */
    if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
        return -1;
    }

    if (isdigit(name[0])) {
        /* position index - creating without keys */
        *parsed += r;
        return 0;
    }

    /* it's not a number, so there must be some keys */
    if (!slist->keys_size) {
        /* there are none, so pretend we did not parse anything to get invalid char error later */
        return 0;
    }

    /* go through all the keys */
    i = 0;
    goto check_parsed_values;

    for (; i < slist->keys_size; ++i) {
        if (!has_predicate) {
            LOGVAL(LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, list_name);
            return -1;
        }

        if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
                || !strncmp(name, ".", nam_len)) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
            return -1;
        }

check_parsed_values:
        *parsed += r;
        predicate += r;

        if (!value || strncmp(slist->keys[i]->name, name, nam_len) || slist->keys[i]->name[nam_len]) {
            LOGVAL(LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }

        key_val = malloc((val_len + 1) * sizeof(char));
        if (!key_val) {
            LOGMEM;
            return -1;
        }
        strncpy(key_val, value, val_len);
        key_val[val_len] = '\0';

        if (!_lyd_new_leaf(list, (const struct lys_node *)slist->keys[i], key_val, 0)) {
            free(key_val);
            return -1;
        }
        free(key_val);
    }

    return 0;
}